

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  TTDInnerLoopLogWriteEventLogEntry *pTVar1;
  TTDInnerLoopLogWriteEventLogEntry *ilevt;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  EventLogEntry *evt_local;
  
  pTVar1 = GetInlineEventDataAs<TTD::NSLogEvents::TTDInnerLoopLogWriteEventLogEntry,(TTD::NSLogEvents::EventKind)14>
                     (evt);
  FileWriter::WriteLogTag(writer,sourceContextId,pTVar1->SourceScriptLogId,CommaSeparator);
  FileWriter::WriteInt64(writer,eventTime,pTVar1->EventTime,CommaSeparator);
  FileWriter::WriteInt64(writer,functionTime,pTVar1->FunctionTime,CommaSeparator);
  FileWriter::WriteInt64(writer,loopTime,pTVar1->LoopTime,CommaSeparator);
  FileWriter::WriteUInt32(writer,functionBodyId,pTVar1->TopLevelBodyId,CommaSeparator);
  FileWriter::WriteUInt32(writer,functionColumn,pTVar1->FunctionLine,CommaSeparator);
  FileWriter::WriteUInt32(writer,functionLine,pTVar1->FunctionColumn,CommaSeparator);
  FileWriter::WriteUInt32(writer,line,pTVar1->Line,CommaSeparator);
  FileWriter::WriteUInt32(writer,column,pTVar1->Column,CommaSeparator);
  return;
}

Assistant:

void TTDInnerLoopLogWriteEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const TTDInnerLoopLogWriteEventLogEntry* ilevt = GetInlineEventDataAs<TTDInnerLoopLogWriteEventLogEntry, EventKind::TTDInnerLoopLogWriteTag>(evt);

            writer->WriteLogTag(NSTokens::Key::sourceContextId, ilevt->SourceScriptLogId, NSTokens::Separator::CommaSeparator);
            writer->WriteInt64(NSTokens::Key::eventTime, ilevt->EventTime, NSTokens::Separator::CommaSeparator);
            writer->WriteInt64(NSTokens::Key::functionTime, ilevt->FunctionTime, NSTokens::Separator::CommaSeparator);
            writer->WriteInt64(NSTokens::Key::loopTime, ilevt->LoopTime, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::functionBodyId, ilevt->TopLevelBodyId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::functionColumn, ilevt->FunctionLine, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::functionLine, ilevt->FunctionColumn, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::line, ilevt->Line, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::column, ilevt->Column, NSTokens::Separator::CommaSeparator);
        }